

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O3

Expression * __thiscall
soul::ResolutionPass::FunctionResolver::createAdvanceCall(FunctionResolver *this,CallOrCast *c)

{
  CommaSeparatedList *pCVar1;
  Expression *pEVar2;
  CompileMessage local_80;
  CompileMessage local_48;
  
  if ((c->super_CallOrCastBase).isMethodCall == true) {
    CompileMessageHelpers::createMessage<>
              (&local_48,syntax,error,"The advance() function cannot be used as a method call");
    AST::Context::throwError
              (&(c->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.context,
               &local_48,false);
  }
  pCVar1 = (c->super_CallOrCastBase).arguments.object;
  if ((pCVar1 != (CommaSeparatedList *)0x0) && ((pCVar1->items).numActive != 0)) {
    CompileMessageHelpers::createMessage<>
              (&local_80,syntax,error,"The advance() function does not take any arguments");
    AST::Context::throwError
              (&(c->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.context,
               &local_80,false);
  }
  pEVar2 = &PoolAllocator::allocate<soul::AST::AdvanceClock,soul::AST::Context&>
                      (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,
                       &(c->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
                        context)->super_Expression;
  return pEVar2;
}

Assistant:

AST::Expression& createAdvanceCall (AST::CallOrCast& c)
        {
            if (c.isMethodCall)             c.context.throwError (Errors::advanceIsNotAMethod());
            if (c.getNumArguments() != 0)   c.context.throwError (Errors::advanceHasNoArgs());

            return allocator.allocate<AST::AdvanceClock> (c.context);
        }